

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

string * __thiscall
QPDFObjectHandle::getName_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = isName(this);
  if (bVar1) {
    QPDFObject::getStringValue_abi_cxx11_
              (__return_storage_ptr__,
               (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"returning dummy name",&local_39);
    typeWarning(this,"name",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"/QPDFFakeName",(allocator<char> *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::getName() const
{
    if (isName()) {
        return obj->getStringValue();
    } else {
        typeWarning("name", "returning dummy name");
        QTC::TC("qpdf", "QPDFObjectHandle name returning dummy name");
        return "/QPDFFakeName";
    }
}